

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TParseContext::handleDotDereference
          (TParseContext *this,TSourceLoc *loc,TIntermTyped *base,TString *field)

{
  TIntermediate *this_00;
  byte bVar1;
  TString *pTVar2;
  TIntermTyped *pTVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  TType *pTVar8;
  size_type sVar9;
  const_reference pvVar10;
  undefined4 extraout_var;
  TIntermConstantUnion *index_00;
  undefined4 extraout_var_00;
  TQualifier *to;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar11;
  undefined4 extraout_var_04;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_01;
  char *pcVar12;
  char *pcVar13;
  TQualifier *pTVar14;
  long *plVar15;
  long lVar16;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *local_290;
  pool_allocator<char> local_240;
  TString local_238;
  pool_allocator<char> local_210;
  TString local_208;
  TString local_1e0;
  undefined1 local_1b8 [8];
  TString structName;
  TIntermBinary *binaryNode;
  TIntermTyped *baseSymbol;
  TIntermTyped *index;
  int member;
  bool fieldFound;
  TTypeList *fields;
  TIntermTyped *result;
  pool_allocator<char> local_c8;
  TString local_c0;
  pool_allocator<char> local_98;
  TString local_90;
  TString local_68;
  byte local_39;
  char *pcStack_38;
  bool enhanced;
  char *feature;
  TString *field_local;
  TIntermTyped *base_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  feature = (char *)field;
  field_local = (TString *)base;
  base_local = (TIntermTyped *)loc;
  loc_local = (TSourceLoc *)this;
  variableCheck(this,(TIntermTyped **)&field_local);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)feature,"length");
  if (bVar4) {
    uVar7 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].inUseList)();
    if ((uVar7 & 1) == 0) {
      uVar7 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].stack.
                        super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                        ._M_impl.super__Vector_impl_data._M_start)();
      if (((uVar7 & 1) == 0) &&
         (uVar7 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].freeList)()
         , (uVar7 & 1) == 0)) {
        pTVar8 = (TType *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].
                                    inUseList)();
        bVar4 = TType::isCoopMat(pTVar8);
        if (!bVar4) {
          pTVar8 = (TType *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].
                                      inUseList)();
          bVar4 = TType::isCoopVecNV(pTVar8);
          if (!bVar4) {
            local_39 = TIntermediate::getEnhancedMsgs
                                 ((this->super_TParseContextBase).super_TParseVersions.intermediate)
            ;
            pTVar3 = base_local;
            pcVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)feature);
            pTVar8 = (TType *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2]
                                        .inUseList)();
            bVar1 = local_39;
            pool_allocator<char>::pool_allocator(&local_98);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_90,"",&local_98);
            pool_allocator<char>::pool_allocator(&local_c8);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_c0,"",&local_c8);
            TType::getCompleteString
                      (&local_68,pTVar8,(bool)(bVar1 & 1),true,true,true,&local_90,&local_c0);
            pcVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str(&local_68);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,pTVar3,"does not operate on this type:",pcVar12,pcVar13);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_68);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_c0);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_90);
            return (TIntermTyped *)field_local;
          }
        }
      }
      else {
        pcStack_38 = ".length() on vectors and matrices";
        TParseVersions::requireProfile
                  ((TParseVersions *)this,(TSourceLoc *)base_local,-9,
                   ".length() on vectors and matrices");
        TParseVersions::profileRequires
                  ((TParseVersions *)this,(TSourceLoc *)base_local,-9,0x1a4,
                   "GL_ARB_shading_language_420pack",pcStack_38);
      }
    }
    else {
      TParseVersions::profileRequires
                ((TParseVersions *)this,(TSourceLoc *)base_local,1,0x78,"GL_3DL_array_objects",
                 ".length");
      TParseVersions::profileRequires
                ((TParseVersions *)this,(TSourceLoc *)base_local,8,300,(char *)0x0,".length");
    }
    pTVar2 = field_local;
    this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    TType::TType((TType *)&result,EbtInt,EvqTemporary,1,0,0,false);
    this_local = (TParseContext *)
                 TIntermediate::addMethod
                           (this_00,(TIntermTyped *)pTVar2,(TType *)&result,(TString *)feature,
                            (TSourceLoc *)base_local);
    TType::~TType((TType *)&result);
  }
  else {
    uVar7 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].inUseList)();
    pTVar3 = base_local;
    if ((uVar7 & 1) == 0) {
      pTVar8 = (TType *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].
                                  inUseList)();
      bVar4 = TType::isCoopMat(pTVar8);
      pTVar3 = base_local;
      if (bVar4) {
        pcVar12 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                            ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)feature);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar3,"cannot apply to a cooperative matrix type:",".",pcVar12);
        this_local = (TParseContext *)field_local;
      }
      else {
        fields = (TTypeList *)field_local;
        uVar7 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].stack.
                          super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                          ._M_impl.super__Vector_impl_data._M_start)();
        if ((((uVar7 & 1) == 0) &&
            (uVar7 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].stack.
                               super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                               ._M_impl.super__Vector_impl_data._M_finish)(), (uVar7 & 1) == 0)) ||
           ((uVar7 = (**(code **)&(field_local->_M_dataplus).super_allocator_type.allocator[3].
                                  numCalls)(), (uVar7 & 1) == 0 &&
            ((uVar7 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].
                                totalBytes)(), (uVar7 & 1) == 0 &&
             (iVar6 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].stack.
                                super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                                ._M_impl.super__Vector_impl_data._M_finish)(), iVar6 != 0xc)))))) {
          uVar7 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].stack.
                            super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)();
          if (((uVar7 & 1) != 0) ||
             (bVar4 = TIntermTyped::isReference((TIntermTyped *)field_local), pTVar3 = base_local,
             bVar4)) {
            bVar4 = TIntermTyped::isReference((TIntermTyped *)field_local);
            if (bVar4) {
              plVar15 = (long *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator
                                          [2].inUseList)();
              pTVar8 = (TType *)(**(code **)(*plVar15 + 0xa8))();
              local_290 = &TType::getStruct(pTVar8)->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
              ;
            }
            else {
              pTVar8 = (TType *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator
                                          [2].inUseList)();
              local_290 = &TType::getStruct(pTVar8)->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
              ;
            }
            bVar4 = false;
            for (index._0_4_ = 0;
                sVar9 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ::size(local_290), (int)index < (int)sVar9; index._0_4_ = (int)index + 1) {
              pvVar10 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ::operator[](local_290,(long)(int)index);
              iVar6 = (*pvVar10->type->_vptr_TType[6])();
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                       *)CONCAT44(extraout_var,iVar6),
                                      (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                       *)feature);
              if (bVar5) {
                bVar4 = true;
                break;
              }
            }
            pTVar3 = base_local;
            pTVar2 = field_local;
            if (bVar4) {
              if (((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan != 0) &&
                 (((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed &
                  1U) != 0)) {
                pvVar10 = std::
                          vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                          operator[](local_290,(long)(int)index);
                fields = (TTypeList *)
                         vkRelaxedRemapDotDereference
                                   (this,(TSourceLoc *)pTVar3,(TIntermTyped *)pTVar2,pvVar10->type,
                                    (TString *)feature);
              }
              if ((TString *)fields == field_local) {
                plVar15 = (long *)(*(code *)(field_local->_M_dataplus).super_allocator_type.
                                            allocator[2].inUseList)();
                pTVar14 = (TQualifier *)(**(code **)(*plVar15 + 0x58))();
                bVar4 = TQualifier::isFrontEndConstant(pTVar14);
                if (bVar4) {
                  fields = (TTypeList *)
                           TIntermediate::foldDereference
                                     ((this->super_TParseContextBase).super_TParseVersions.
                                      intermediate,(TIntermTyped *)field_local,(int)index,
                                      (TSourceLoc *)base_local);
                }
                else {
                  blockMemberExtensionCheck
                            (this,(TSourceLoc *)base_local,(TIntermTyped *)field_local,(int)index,
                             (TString *)feature);
                  index_00 = TIntermediate::addConstantUnion
                                       ((this->super_TParseContextBase).super_TParseVersions.
                                        intermediate,(int)index,(TSourceLoc *)base_local,false);
                  fields = (TTypeList *)
                           TIntermediate::addIndex
                                     ((this->super_TParseContextBase).super_TParseVersions.
                                      intermediate,EOpIndexDirectStruct,(TIntermTyped *)field_local,
                                      &index_00->super_TIntermTyped,(TSourceLoc *)base_local);
                  pvVar10 = std::
                            vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                            operator[](local_290,(long)(int)index);
                  (*(((TIntermTyped *)fields)->super_TIntermNode)._vptr_TIntermNode[0x1d])
                            (fields,pvVar10->type);
                  pvVar10 = std::
                            vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                            operator[](local_290,(long)(int)index);
                  iVar6 = (*pvVar10->type->_vptr_TType[10])();
                  bVar4 = TQualifier::isIo((TQualifier *)CONCAT44(extraout_var_00,iVar6));
                  if (bVar4) {
                    TIntermediate::addIoAccessed
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               (TString *)feature);
                  }
                }
              }
              pTVar14 = (TQualifier *)
                        (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].stack
                                  .
                                  super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)();
              plVar15 = (long *)(**(code **)&(fields->
                                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                             ).
                                             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                             ._M_impl.super__Tp_alloc_type.allocator[2].stack.
                                             super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                                             ._M_impl.super__Vector_impl_data)();
              to = (TQualifier *)(**(code **)(*plVar15 + 0x50))();
              inheritMemoryQualifiers(this,pTVar14,to);
            }
            else {
              binaryNode = (TIntermBinary *)field_local;
              while (iVar6 = (*(binaryNode->super_TIntermOperator).super_TIntermTyped.
                               super_TIntermNode._vptr_TIntermNode[0xc])(),
                    CONCAT44(extraout_var_01,iVar6) == 0) {
                iVar6 = (*(binaryNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[8])();
                structName.field_2._8_8_ = CONCAT44(extraout_var_02,iVar6);
                if ((long *)structName.field_2._8_8_ == (long *)0x0) break;
                binaryNode = (TIntermBinary *)
                             (**(code **)(*(long *)structName.field_2._8_8_ + 400))();
              }
              iVar6 = (*(binaryNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                        _vptr_TIntermNode[0xc])();
              pTVar3 = base_local;
              if (CONCAT44(extraout_var_03,iVar6) == 0) {
                pcVar12 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)feature);
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,pTVar3,"no such field in structure",pcVar12,"");
              }
              else {
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)local_1b8);
                pbVar11 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    *)local_1b8,"\'");
                iVar6 = (*(binaryNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[0xc])();
                this_01 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar6) + 400))();
                pcVar12 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::c_str(this_01);
                pbVar11 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::append(pbVar11,pcVar12);
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          (pbVar11,"\'");
                pTVar3 = base_local;
                pcVar12 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)feature);
                pcVar13 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)local_1b8);
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,pTVar3,"no such field in structure",pcVar12,pcVar13);
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)local_1b8);
              }
            }
          }
          else {
            pcVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)feature);
            pTVar8 = (TType *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2]
                                        .inUseList)();
            bVar4 = TIntermediate::getEnhancedMsgs
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate);
            pool_allocator<char>::pool_allocator(&local_210);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_208,"",&local_210);
            pool_allocator<char>::pool_allocator(&local_240);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_238,"",&local_240);
            TType::getCompleteString(&local_1e0,pTVar8,bVar4,true,true,true,&local_208,&local_238);
            pcVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str(&local_1e0);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,pTVar3,"does not apply to this type:",pcVar12,pcVar13);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_1e0);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_238);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_208);
          }
        }
        else {
          fields = (TTypeList *)
                   handleDotSwizzle(this,(TSourceLoc *)base_local,(TIntermTyped *)field_local,
                                    (TString *)feature);
        }
        pTVar14 = (TQualifier *)
                  (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].stack.
                            super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)();
        bVar4 = TQualifier::isNoContraction(pTVar14);
        if (bVar4) {
          plVar15 = (long *)(**(code **)&(fields->
                                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ).
                                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ._M_impl.super__Tp_alloc_type.allocator[2].stack.
                                         super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                                         ._M_impl.super__Vector_impl_data)();
          pTVar14 = (TQualifier *)(**(code **)(*plVar15 + 0x50))();
          TQualifier::setNoContraction(pTVar14);
        }
        pTVar14 = (TQualifier *)
                  (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].stack.
                            super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)();
        bVar4 = TQualifier::isNonUniform(pTVar14);
        if (bVar4) {
          plVar15 = (long *)(**(code **)&(fields->
                                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ).
                                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ._M_impl.super__Tp_alloc_type.allocator[2].stack.
                                         super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                                         ._M_impl.super__Vector_impl_data)();
          lVar16 = (**(code **)(*plVar15 + 0x50))();
          *(ulong *)(lVar16 + 8) = *(ulong *)(lVar16 + 8) & 0xfffffffdffffffff | 0x200000000;
        }
        this_local = (TParseContext *)fields;
      }
    }
    else {
      pcVar12 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)feature);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar3,"cannot apply to an array:",".",pcVar12);
      this_local = (TParseContext *)field_local;
    }
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* TParseContext::handleDotDereference(const TSourceLoc& loc, TIntermTyped* base, const TString& field)
{
    variableCheck(base);

    //
    // .length() can't be resolved until we later see the function-calling syntax.
    // Save away the name in the AST for now.  Processing is completed in
    // handleLengthMethod().
    //
    if (field == "length") {
        if (base->isArray()) {
            profileRequires(loc, ENoProfile, 120, E_GL_3DL_array_objects, ".length");
            profileRequires(loc, EEsProfile, 300, nullptr, ".length");
        } else if (base->isVector() || base->isMatrix()) {
            const char* feature = ".length() on vectors and matrices";
            requireProfile(loc, ~EEsProfile, feature);
            profileRequires(loc, ~EEsProfile, 420, E_GL_ARB_shading_language_420pack, feature);
        } else if (!base->getType().isCoopMat() && !base->getType().isCoopVecNV()) {
            bool enhanced = intermediate.getEnhancedMsgs();
            error(loc, "does not operate on this type:", field.c_str(), base->getType().getCompleteString(enhanced).c_str());
            return base;
        }

        return intermediate.addMethod(base, TType(EbtInt), &field, loc);
    }

    // It's not .length() if we get to here.

    if (base->isArray()) {
        error(loc, "cannot apply to an array:", ".", field.c_str());

        return base;
    }

    if (base->getType().isCoopMat()) {
        error(loc, "cannot apply to a cooperative matrix type:", ".", field.c_str());
        return base;
    }

    // It's neither an array nor .length() if we get here,
    // leaving swizzles and struct/block dereferences.

    TIntermTyped* result = base;
    if ((base->isVector() || base->isScalar()) &&
        (base->isFloatingDomain() || base->isIntegerDomain() || base->getBasicType() == EbtBool)) {
        result = handleDotSwizzle(loc, base, field);
    } else if (base->isStruct() || base->isReference()) {
        const TTypeList* fields = base->isReference() ?
                                  base->getType().getReferentType()->getStruct() :
                                  base->getType().getStruct();
        bool fieldFound = false;
        int member;
        for (member = 0; member < (int)fields->size(); ++member) {
            if ((*fields)[member].type->getFieldName() == field) {
                fieldFound = true;
                break;
            }
        }

        if (fieldFound) {
            if (spvVersion.vulkan != 0 && spvVersion.vulkanRelaxed)
                result = vkRelaxedRemapDotDereference(loc, *base, *(*fields)[member].type, field);

            if (result == base)
            {
                if (base->getType().getQualifier().isFrontEndConstant())
                    result = intermediate.foldDereference(base, member, loc);
                else {
                    blockMemberExtensionCheck(loc, base, member, field);
                    TIntermTyped* index = intermediate.addConstantUnion(member, loc);
                    result = intermediate.addIndex(EOpIndexDirectStruct, base, index, loc);
                    result->setType(*(*fields)[member].type);
                    if ((*fields)[member].type->getQualifier().isIo())
                        intermediate.addIoAccessed(field);
                }
            }

            inheritMemoryQualifiers(base->getQualifier(), result->getWritableType().getQualifier());
        } else {
            auto baseSymbol = base;
            while (baseSymbol->getAsSymbolNode() == nullptr) {
                auto binaryNode = baseSymbol->getAsBinaryNode();
                if (binaryNode == nullptr) break;
                baseSymbol = binaryNode->getLeft();
            }
            if (baseSymbol->getAsSymbolNode() != nullptr) {
                TString structName;
                structName.append("\'").append(baseSymbol->getAsSymbolNode()->getName().c_str()).append("\'");
                error(loc, "no such field in structure", field.c_str(), structName.c_str());
            } else {
                error(loc, "no such field in structure", field.c_str(), "");
            }
        }
    } else
        error(loc, "does not apply to this type:", field.c_str(),
          base->getType().getCompleteString(intermediate.getEnhancedMsgs()).c_str());

    // Propagate noContraction up the dereference chain
    if (base->getQualifier().isNoContraction())
        result->getWritableType().getQualifier().setNoContraction();

    // Propagate nonuniform
    if (base->getQualifier().isNonUniform())
        result->getWritableType().getQualifier().nonUniform = true;

    return result;
}